

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O0

void __thiscall
phmap::priv::
btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::Less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_false>_>,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*>
::decrement_slow(btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::Less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_false>_>,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*>
                 *this)

{
  undefined8 uVar1;
  bool bVar2;
  byte bVar3;
  btree_node<phmap::priv::map_params<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::Less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_false>_>
  *pbVar4;
  btree_node<phmap::priv::map_params<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::Less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_false>_>
  *pbVar5;
  byte local_29;
  btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::Less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_false>_>,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*>
  save;
  btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::Less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_false>_>,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*>
  *this_local;
  
  bVar2 = btree_node<phmap::priv::map_params<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::Less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_false>_>
          ::leaf(this->node);
  if (bVar2) {
    if ((uint)this->position < 0x80000000) {
      __assert_fail("position <= -1",
                    "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                    ,0x989,
                    "void phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int, std::basic_string<char>, phmap::Less<int>, std::allocator<std::pair<const int, std::basic_string<char>>>, 256, false>>, std::pair<const int, std::basic_string<char>> &, std::pair<const int, std::basic_string<char>> *>::decrement_slow() [Node = phmap::priv::btree_node<phmap::priv::map_params<int, std::basic_string<char>, phmap::Less<int>, std::allocator<std::pair<const int, std::basic_string<char>>>, 256, false>>, Reference = std::pair<const int, std::basic_string<char>> &, Pointer = std::pair<const int, std::basic_string<char>> *]"
                   );
    }
    pbVar5 = this->node;
    uVar1 = *(undefined8 *)&this->position;
    while( true ) {
      local_29 = 0;
      if (this->position < 0) {
        bVar2 = btree_node<phmap::priv::map_params<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::Less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_false>_>
                ::is_root(this->node);
        local_29 = bVar2 ^ 0xff;
      }
      if ((local_29 & 1) == 0) break;
      pbVar4 = btree_node<phmap::priv::map_params<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::Less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_false>_>
               ::parent(this->node);
      bVar3 = btree_node<phmap::priv::map_params<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::Less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_false>_>
              ::position(this->node);
      pbVar4 = btree_node<phmap::priv::map_params<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::Less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_false>_>
               ::child(pbVar4,(ulong)bVar3);
      if (pbVar4 != this->node) {
        __assert_fail("node->parent()->child(node->position()) == node",
                      "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                      ,0x98c,
                      "void phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int, std::basic_string<char>, phmap::Less<int>, std::allocator<std::pair<const int, std::basic_string<char>>>, 256, false>>, std::pair<const int, std::basic_string<char>> &, std::pair<const int, std::basic_string<char>> *>::decrement_slow() [Node = phmap::priv::btree_node<phmap::priv::map_params<int, std::basic_string<char>, phmap::Less<int>, std::allocator<std::pair<const int, std::basic_string<char>>>, 256, false>>, Reference = std::pair<const int, std::basic_string<char>> &, Pointer = std::pair<const int, std::basic_string<char>> *]"
                     );
      }
      bVar3 = btree_node<phmap::priv::map_params<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::Less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_false>_>
              ::position(this->node);
      this->position = bVar3 - 1;
      pbVar4 = btree_node<phmap::priv::map_params<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::Less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_false>_>
               ::parent(this->node);
      this->node = pbVar4;
    }
    if (this->position < 0) {
      this->node = pbVar5;
      save.node._0_4_ = (int)uVar1;
      this->position = (int)save.node;
    }
  }
  else {
    if (this->position < 0) {
      __assert_fail("position >= 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                    ,0x994,
                    "void phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int, std::basic_string<char>, phmap::Less<int>, std::allocator<std::pair<const int, std::basic_string<char>>>, 256, false>>, std::pair<const int, std::basic_string<char>> &, std::pair<const int, std::basic_string<char>> *>::decrement_slow() [Node = phmap::priv::btree_node<phmap::priv::map_params<int, std::basic_string<char>, phmap::Less<int>, std::allocator<std::pair<const int, std::basic_string<char>>>, 256, false>>, Reference = std::pair<const int, std::basic_string<char>> &, Pointer = std::pair<const int, std::basic_string<char>> *]"
                   );
    }
    pbVar5 = btree_node<phmap::priv::map_params<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::Less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_false>_>
             ::child(this->node,(long)this->position);
    this->node = pbVar5;
    while (bVar2 = btree_node<phmap::priv::map_params<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::Less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_false>_>
                   ::leaf(this->node), ((bVar2 ^ 0xffU) & 1) != 0) {
      pbVar5 = this->node;
      bVar3 = btree_node<phmap::priv::map_params<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::Less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_false>_>
              ::count(this->node);
      pbVar5 = btree_node<phmap::priv::map_params<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::Less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_false>_>
               ::child(pbVar5,(ulong)bVar3);
      this->node = pbVar5;
    }
    bVar3 = btree_node<phmap::priv::map_params<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::Less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_false>_>
            ::count(this->node);
    this->position = bVar3 - 1;
  }
  return;
}

Assistant:

void btree_iterator<N, R, P>::decrement_slow() {
        if (node->leaf()) {
            assert(position <= -1);
            btree_iterator save(*this);
            while (position < 0 && !node->is_root()) {
                assert(node->parent()->child(node->position()) == node);
                position = node->position() - 1;
                node = node->parent();
            }
            if (position < 0) {
                *this = save;
            }
        } else {
            assert(position >= 0);
            node = node->child(position);
            while (!node->leaf()) {
                node = node->child(node->count());
            }
            position = node->count() - 1;
        }
    }